

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O0

unsigned_short ncnn::float32_to_float16(float value)

{
  ushort uVar1;
  ushort uVar2;
  short sVar3;
  uint uVar4;
  unsigned_short sig;
  short newexp;
  unsigned_short fp16;
  uint significand;
  unsigned_short exponent;
  unsigned_short sign;
  anon_union_4_2_947300b0 tmp;
  float value_local;
  
  uVar2 = (ushort)((uint)value >> 0x10);
  uVar1 = uVar2 >> 0xf;
  uVar2 = (uVar2 & 0x7f80) >> 7;
  uVar4 = (uint)value & 0x7fffff;
  if (uVar2 == 0) {
    fp16 = uVar1 << 0xf;
  }
  else if (uVar2 == 0xff) {
    uVar2 = 0;
    if (uVar4 != 0) {
      uVar2 = 0x200;
    }
    fp16 = uVar1 << 0xf | 0x7c00 | uVar2;
  }
  else {
    sVar3 = uVar2 - 0x70;
    if (sVar3 < 0x1f) {
      if (sVar3 < 1) {
        if (sVar3 < -10) {
          fp16 = uVar1 << 0xf;
        }
        else {
          fp16 = uVar1 << 0xf | (ushort)((uVar4 | 0x800000) >> (0xeU - (char)sVar3 & 0x1f));
        }
      }
      else {
        fp16 = uVar1 << 0xf | sVar3 * 0x400 | (ushort)(uVar4 >> 0xd);
      }
    }
    else {
      fp16 = uVar1 << 0xf | 0x7c00;
    }
  }
  return fp16;
}

Assistant:

unsigned short float32_to_float16(float value)
{
    // 1 : 8 : 23
    union
    {
        unsigned int u;
        float f;
    } tmp;

    tmp.f = value;

    // 1 : 8 : 23
    unsigned short sign = (tmp.u & 0x80000000) >> 31;
    unsigned short exponent = (tmp.u & 0x7F800000) >> 23;
    unsigned int significand = tmp.u & 0x7FFFFF;

    //     NCNN_LOGE("%d %d %d", sign, exponent, significand);

    // 1 : 5 : 10
    unsigned short fp16;
    if (exponent == 0)
    {
        // zero or denormal, always underflow
        fp16 = (sign << 15) | (0x00 << 10) | 0x00;
    }
    else if (exponent == 0xFF)
    {
        // infinity or NaN
        fp16 = (sign << 15) | (0x1F << 10) | (significand ? 0x200 : 0x00);
    }
    else
    {
        // normalized
        short newexp = exponent + (- 127 + 15);
        if (newexp >= 31)
        {
            // overflow, return infinity
            fp16 = (sign << 15) | (0x1F << 10) | 0x00;
        }
        else if (newexp <= 0)
        {
            // underflow
            if (newexp >= -10)
            {
                // denormal half-precision
                unsigned short sig = (significand | 0x800000) >> (14 - newexp);
                fp16 = (sign << 15) | (0x00 << 10) | sig;
            }
            else
            {
                // underflow
                fp16 = (sign << 15) | (0x00 << 10) | 0x00;
            }
        }
        else
        {
            fp16 = (sign << 15) | (newexp << 10) | (significand >> 13);
        }
    }

    return fp16;
}